

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

bool __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv>::functionPointerCall
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv> *this,PSNode *callsite,
          PSNode *called)

{
  StringRef RHS;
  StringRef LHS;
  ret_type pFVar1;
  ulong uVar2;
  PSNode *in_RDX;
  PSNode *in_RSI;
  PointerAnalysisFS *in_RDI;
  bool bVar3;
  StringRef SVar4;
  Function *F;
  PSNode *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  StringRef *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  
  SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
            ((SubgraphNode<dg::pta::PSNode> *)(in_RDX + 8));
  pFVar1 = llvm::dyn_cast<llvm::Function,llvm::Value>((Value *)in_RDI);
  if (pFVar1 == (ret_type)0x0) {
    return false;
  }
  uVar2 = llvm::GlobalValue::isDeclaration();
  if (((uVar2 & 1) != 0) &&
     (bVar3 = pta::LLVMPointerGraphBuilder::threads
                        ((LLVMPointerGraphBuilder *)
                         in_RDI[1].super_PointerAnalysis._vptr_PointerAnalysis), bVar3)) {
    llvm::Value::getName();
    llvm::StringRef::StringRef(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    LHS.Length = in_stack_ffffffffffffffb0;
    LHS.Data = in_stack_ffffffffffffffa8;
    SVar4.Length = (size_t)in_stack_ffffffffffffffa0;
    SVar4.Data = in_stack_ffffffffffffff98;
    bVar3 = llvm::operator==(LHS,SVar4);
    if (bVar3) {
      dg::pta::LLVMPointerGraphBuilder::insertPthreadCreateByPtrCall
                ((PSNode *)in_RDI[1].super_PointerAnalysis._vptr_PointerAnalysis);
      return true;
    }
    SVar4 = (StringRef)llvm::Value::getName();
    llvm::StringRef::StringRef(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    RHS.Length = (size_t)in_stack_ffffffffffffffa0;
    RHS.Data = in_stack_ffffffffffffff98;
    bVar3 = llvm::operator==(SVar4,RHS);
    if (bVar3) {
      dg::pta::LLVMPointerGraphBuilder::insertPthreadJoinByPtrCall
                ((PSNode *)in_RDI[1].super_PointerAnalysis._vptr_PointerAnalysis);
      return true;
    }
  }
  uVar2 = dg::pta::LLVMPointerGraphBuilder::callIsCompatible(in_RSI,in_RDX);
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    dg::pta::LLVMPointerGraphBuilder::insertFunctionCall
              ((PSNode *)in_RDI[1].super_PointerAnalysis._vptr_PointerAnalysis,in_RSI);
    pta::PointerAnalysisFS::functionPointerCall(in_RDI,in_stack_ffffffffffffff88,(PSNode *)0x181769)
    ;
  }
  return bVar3;
}

Assistant:

bool functionPointerCall(PSNode *callsite, PSNode *called) override {
        using namespace pta;
        const llvm::Function *F = llvm::dyn_cast<llvm::Function>(
                called->getUserData<llvm::Value>());
        // with vararg it may happen that we get pointer that
        // is not to function, so just bail out here in that case
        if (!F)
            return false;

        if (F->isDeclaration()) {
            if (builder->threads()) {
                if (F->getName() == "pthread_create") {
                    builder->insertPthreadCreateByPtrCall(callsite);
                    return true;
                }
                if (F->getName() == "pthread_join") {
                    builder->insertPthreadJoinByPtrCall(callsite);
                    return true;
                }
            }
        }

        if (!LLVMPointerGraphBuilder::callIsCompatible(callsite, called)) {
            return false;
        }

        builder->insertFunctionCall(callsite, called);

        // call the original handler that works on generic graphs
        PTType::functionPointerCall(callsite, called);

#ifndef NDEBUG
        // check the graph after rebuilding, but do not check for connectivity,
        // because we can call a function that will disconnect the graph
        if (!builder->validateSubgraph(true)) {
            llvm::errs() << "Pointer Subgraph is broken!\n";
            llvm::errs() << "This happend after building this function called "
                            "via pointer: "
                         << F->getName() << "\n";
            abort();
        }
#endif // NDEBUG

        return true; // we changed the graph
    }